

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlainObjectBase.h
# Opt level: O0

Matrix<int,_4,_1,_0,_4,_1> * __thiscall
Eigen::PlainObjectBase<Eigen::Matrix<int,4,1,0,4,1>>::
_set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<int>,Eigen::Matrix<int,4,1,0,4,1>>>
          (PlainObjectBase<Eigen::Matrix<int,4,1,0,4,1>> *this,
          DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<int>,_Eigen::Matrix<int,_4,_1,_0,_4,_1>_>_>
          *other)

{
  Matrix<int,_4,_1,_0,_4,_1> *pMVar1;
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<int>,_Eigen::Matrix<int,_4,_1,_0,_4,_1>_> *src;
  assign_op<int,_int> local_19;
  EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<int>,_Eigen::Matrix<int,_4,_1,_0,_4,_1>_>_>
  *local_18;
  DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<int>,_Eigen::Matrix<int,_4,_1,_0,_4,_1>_>_>
  *other_local;
  PlainObjectBase<Eigen::Matrix<int,_4,_1,_0,_4,_1>_> *this_local;
  
  local_18 = (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<int>,_Eigen::Matrix<int,_4,_1,_0,_4,_1>_>_>
              *)other;
  other_local = (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<int>,_Eigen::Matrix<int,_4,_1,_0,_4,_1>_>_>
                 *)this;
  pMVar1 = EigenBase<Eigen::Matrix<int,_4,_1,_0,_4,_1>_>::derived
                     ((EigenBase<Eigen::Matrix<int,_4,_1,_0,_4,_1>_> *)this);
  src = EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<int>,_Eigen::Matrix<int,_4,_1,_0,_4,_1>_>_>
        ::derived(local_18);
  internal::assign_op<int,_int>::assign_op(&local_19);
  internal::
  call_assignment_no_alias<Eigen::Matrix<int,4,1,0,4,1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<int>,Eigen::Matrix<int,4,1,0,4,1>>,Eigen::internal::assign_op<int,int>>
            (pMVar1,src,&local_19);
  pMVar1 = EigenBase<Eigen::Matrix<int,_4,_1,_0,_4,_1>_>::derived
                     ((EigenBase<Eigen::Matrix<int,_4,_1,_0,_4,_1>_> *)this);
  return pMVar1;
}

Assistant:

EIGEN_DEVICE_FUNC
    EIGEN_STRONG_INLINE Derived& _set_noalias(const DenseBase<OtherDerived>& other)
    {
      // I don't think we need this resize call since the lazyAssign will anyways resize
      // and lazyAssign will be called by the assign selector.
      //_resize_to_match(other);
      // the 'false' below means to enforce lazy evaluation. We don't use lazyAssign() because
      // it wouldn't allow to copy a row-vector into a column-vector.
      internal::call_assignment_no_alias(this->derived(), other.derived(), internal::assign_op<Scalar,typename OtherDerived::Scalar>());
      return this->derived();
    }